

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  pointer pSVar2;
  size_t sVar3;
  ostream *poVar4;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  char local_2a [2];
  SourceLineInfo local_28;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar2 -
                   (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
    local_28.file = (char *)((ulong)local_28.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar2 = pSVar2 + 1, pSVar2 != pSVar1) {
      printHeaderString(this,&pSVar2->name,2);
    }
    Colour::use(None);
    pSVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_28.file = pSVar2[-1].lineInfo.file;
  local_28.line = pSVar2[-1].lineInfo.line;
  poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a3f50 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a3f57._0_1_ = '-';
    uRam00000000001a3f57._1_1_ = '-';
    uRam00000000001a3f57._2_1_ = '-';
    uRam00000000001a3f57._3_1_ = '-';
    uRam00000000001a3f57._4_1_ = '-';
    uRam00000000001a3f57._5_1_ = '-';
    uRam00000000001a3f57._6_1_ = '-';
    uRam00000000001a3f57._7_1_ = '-';
    DAT_001a3f40 = '-';
    DAT_001a3f40_1._0_1_ = '-';
    DAT_001a3f40_1._1_1_ = '-';
    DAT_001a3f40_1._2_1_ = '-';
    DAT_001a3f40_1._3_1_ = '-';
    DAT_001a3f40_1._4_1_ = '-';
    DAT_001a3f40_1._5_1_ = '-';
    DAT_001a3f40_1._6_1_ = '-';
    uRam00000000001a3f48 = 0x2d2d2d2d2d2d2d;
    DAT_001a3f4f = 0x2d;
    DAT_001a3f30 = '-';
    DAT_001a3f30_1._0_1_ = '-';
    DAT_001a3f30_1._1_1_ = '-';
    DAT_001a3f30_1._2_1_ = '-';
    DAT_001a3f30_1._3_1_ = '-';
    DAT_001a3f30_1._4_1_ = '-';
    DAT_001a3f30_1._5_1_ = '-';
    DAT_001a3f30_1._6_1_ = '-';
    uRam00000000001a3f38._0_1_ = '-';
    uRam00000000001a3f38._1_1_ = '-';
    uRam00000000001a3f38._2_1_ = '-';
    uRam00000000001a3f38._3_1_ = '-';
    uRam00000000001a3f38._4_1_ = '-';
    uRam00000000001a3f38._5_1_ = '-';
    uRam00000000001a3f38._6_1_ = '-';
    uRam00000000001a3f38._7_1_ = '-';
    DAT_001a3f20 = '-';
    DAT_001a3f20_1._0_1_ = '-';
    DAT_001a3f20_1._1_1_ = '-';
    DAT_001a3f20_1._2_1_ = '-';
    DAT_001a3f20_1._3_1_ = '-';
    DAT_001a3f20_1._4_1_ = '-';
    DAT_001a3f20_1._5_1_ = '-';
    DAT_001a3f20_1._6_1_ = '-';
    uRam00000000001a3f28._0_1_ = '-';
    uRam00000000001a3f28._1_1_ = '-';
    uRam00000000001a3f28._2_1_ = '-';
    uRam00000000001a3f28._3_1_ = '-';
    uRam00000000001a3f28._4_1_ = '-';
    uRam00000000001a3f28._5_1_ = '-';
    uRam00000000001a3f28._6_1_ = '-';
    uRam00000000001a3f28._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a3f18._0_1_ = '-';
    uRam00000000001a3f18._1_1_ = '-';
    uRam00000000001a3f18._2_1_ = '-';
    uRam00000000001a3f18._3_1_ = '-';
    uRam00000000001a3f18._4_1_ = '-';
    uRam00000000001a3f18._5_1_ = '-';
    uRam00000000001a3f18._6_1_ = '-';
    uRam00000000001a3f18._7_1_ = '-';
    DAT_001a3f5f = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&getLineOfChars<(char)45>()::line,sVar3)
  ;
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  local_2a[1] = 0;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  operator<<(os,&local_28);
  local_2a[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,local_2a,1);
  poVar4 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a3ff0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a3ff7._0_1_ = '.';
    uRam00000000001a3ff7._1_1_ = '.';
    uRam00000000001a3ff7._2_1_ = '.';
    uRam00000000001a3ff7._3_1_ = '.';
    uRam00000000001a3ff7._4_1_ = '.';
    uRam00000000001a3ff7._5_1_ = '.';
    uRam00000000001a3ff7._6_1_ = '.';
    uRam00000000001a3ff7._7_1_ = '.';
    DAT_001a3fe0 = '.';
    DAT_001a3fe0_1._0_1_ = '.';
    DAT_001a3fe0_1._1_1_ = '.';
    DAT_001a3fe0_1._2_1_ = '.';
    DAT_001a3fe0_1._3_1_ = '.';
    DAT_001a3fe0_1._4_1_ = '.';
    DAT_001a3fe0_1._5_1_ = '.';
    DAT_001a3fe0_1._6_1_ = '.';
    uRam00000000001a3fe8 = 0x2e2e2e2e2e2e2e;
    DAT_001a3fef = 0x2e;
    DAT_001a3fd0 = '.';
    DAT_001a3fd0_1._0_1_ = '.';
    DAT_001a3fd0_1._1_1_ = '.';
    DAT_001a3fd0_1._2_1_ = '.';
    DAT_001a3fd0_1._3_1_ = '.';
    DAT_001a3fd0_1._4_1_ = '.';
    DAT_001a3fd0_1._5_1_ = '.';
    DAT_001a3fd0_1._6_1_ = '.';
    uRam00000000001a3fd8._0_1_ = '.';
    uRam00000000001a3fd8._1_1_ = '.';
    uRam00000000001a3fd8._2_1_ = '.';
    uRam00000000001a3fd8._3_1_ = '.';
    uRam00000000001a3fd8._4_1_ = '.';
    uRam00000000001a3fd8._5_1_ = '.';
    uRam00000000001a3fd8._6_1_ = '.';
    uRam00000000001a3fd8._7_1_ = '.';
    DAT_001a3fc0 = '.';
    DAT_001a3fc0_1._0_1_ = '.';
    DAT_001a3fc0_1._1_1_ = '.';
    DAT_001a3fc0_1._2_1_ = '.';
    DAT_001a3fc0_1._3_1_ = '.';
    DAT_001a3fc0_1._4_1_ = '.';
    DAT_001a3fc0_1._5_1_ = '.';
    DAT_001a3fc0_1._6_1_ = '.';
    uRam00000000001a3fc8._0_1_ = '.';
    uRam00000000001a3fc8._1_1_ = '.';
    uRam00000000001a3fc8._2_1_ = '.';
    uRam00000000001a3fc8._3_1_ = '.';
    uRam00000000001a3fc8._4_1_ = '.';
    uRam00000000001a3fc8._5_1_ = '.';
    uRam00000000001a3fc8._6_1_ = '.';
    uRam00000000001a3fc8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a3fb8._0_1_ = '.';
    uRam00000000001a3fb8._1_1_ = '.';
    uRam00000000001a3fb8._2_1_ = '.';
    uRam00000000001a3fb8._3_1_ = '.';
    uRam00000000001a3fb8._4_1_ = '.';
    uRam00000000001a3fb8._5_1_ = '.';
    uRam00000000001a3fb8._6_1_ = '.';
    uRam00000000001a3fb8._7_1_ = '.';
    DAT_001a3fff = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,&getLineOfChars<(char)46>()::line,sVar3)
  ;
  local_2a[0] = '\n';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_2a,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}